

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

int check_purpose_timestamp_sign(X509_PURPOSE *xp,X509 *x,int ca)

{
  int iVar1;
  X509_EXTENSION *ex;
  X509_EXTENSION *ext;
  int i_ext;
  int ca_local;
  X509 *x_local;
  X509_PURPOSE *xp_local;
  
  if (ca == 0) {
    if (((x->ex_flags & 2) == 0) ||
       (((x->ex_kusage & 0xffffff3f) == 0 && ((x->ex_kusage & 0xc0) != 0)))) {
      if (((x->ex_flags & 4) == 0) || (x->ex_xkusage != 0x40)) {
        xp_local._4_4_ = 0;
      }
      else {
        iVar1 = X509_get_ext_by_NID((X509 *)x,0x7e,-1);
        if (-1 < iVar1) {
          ex = X509_get_ext((X509 *)x,iVar1);
          iVar1 = X509_EXTENSION_get_critical(ex);
          if (iVar1 == 0) {
            return 0;
          }
        }
        xp_local._4_4_ = 1;
      }
    }
    else {
      xp_local._4_4_ = 0;
    }
  }
  else {
    xp_local._4_4_ = 1;
  }
  return xp_local._4_4_;
}

Assistant:

static int check_purpose_timestamp_sign(const X509_PURPOSE *xp, const X509 *x,
                                        int ca) {
  if (ca) {
    return 1;
  }

  // Check the optional key usage field:
  // if Key Usage is present, it must be one of digitalSignature
  // and/or nonRepudiation (other values are not consistent and shall
  // be rejected).
  if ((x->ex_flags & EXFLAG_KUSAGE) &&
      ((x->ex_kusage &
        ~(X509v3_KU_NON_REPUDIATION | X509v3_KU_DIGITAL_SIGNATURE)) ||
       !(x->ex_kusage &
         (X509v3_KU_NON_REPUDIATION | X509v3_KU_DIGITAL_SIGNATURE)))) {
    return 0;
  }

  // Only time stamp key usage is permitted and it's required.
  //
  // TODO(davidben): Should we check EKUs up the chain like the other cases?
  if (!(x->ex_flags & EXFLAG_XKUSAGE) || x->ex_xkusage != XKU_TIMESTAMP) {
    return 0;
  }

  // Extended Key Usage MUST be critical
  int i_ext = X509_get_ext_by_NID(x, NID_ext_key_usage, -1);
  if (i_ext >= 0) {
    const X509_EXTENSION *ext = X509_get_ext(x, i_ext);
    if (!X509_EXTENSION_get_critical(ext)) {
      return 0;
    }
  }

  return 1;
}